

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::CommitDataRequest::operator==
          (CommitDataRequest *this,CommitDataRequest *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if (((_Var1) && (bVar2 = ::std::operator==(&this->chunks_to_move_,&other->chunks_to_move_), bVar2)
      ) && (bVar2 = ::std::operator==(&this->chunks_to_patch_,&other->chunks_to_patch_), bVar2)) {
    return this->flush_request_id_ == other->flush_request_id_;
  }
  return false;
}

Assistant:

bool CommitDataRequest::operator==(const CommitDataRequest& other) const {
  return unknown_fields_ == other.unknown_fields_
   && chunks_to_move_ == other.chunks_to_move_
   && chunks_to_patch_ == other.chunks_to_patch_
   && flush_request_id_ == other.flush_request_id_;
}